

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.cpp
# Opt level: O3

int newupvalue(FuncState *fs,TString *name,expdesc *v)

{
  int iVar1;
  GCObject *o;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Upvaldesc *pUVar4;
  byte bVar5;
  long lVar6;
  long lVar7;
  Upvaldesc *pUVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  if (fs->nups == 0xff) {
    errorlimit(fs,0xff,"upvalues");
  }
  o = (GCObject *)fs->f;
  iVar1 = (o->p).sizeupvalues;
  if (iVar1 <= (int)(uint)fs->nups) {
    pUVar4 = (Upvaldesc *)
             luaM_growaux_(fs->ls->L,(o->p).upvalues,&(o->p).sizeupvalues,0x10,0xff,"upvalues");
    (o->p).upvalues = pUVar4;
    auVar3 = _DAT_00121020;
    auVar2 = _DAT_00121010;
    if (iVar1 < (o->p).sizeupvalues) {
      pUVar4 = (o->p).upvalues;
      lVar6 = (long)(o->p).sizeupvalues - (long)iVar1;
      lVar7 = lVar6 + -1;
      auVar10._8_4_ = (int)lVar7;
      auVar10._0_8_ = lVar7;
      auVar10._12_4_ = (int)((ulong)lVar7 >> 0x20);
      pUVar8 = pUVar4 + (long)iVar1 + 1;
      uVar9 = 0;
      auVar10 = auVar10 ^ _DAT_00121020;
      do {
        auVar11._8_4_ = (int)uVar9;
        auVar11._0_8_ = uVar9;
        auVar11._12_4_ = (int)(uVar9 >> 0x20);
        auVar11 = (auVar11 | auVar2) ^ auVar3;
        if ((bool)(~(auVar11._4_4_ == auVar10._4_4_ && auVar10._0_4_ < auVar11._0_4_ ||
                    auVar10._4_4_ < auVar11._4_4_) & 1)) {
          pUVar8[-1].name = (TString *)0x0;
        }
        if ((auVar11._12_4_ != auVar10._12_4_ || auVar11._8_4_ <= auVar10._8_4_) &&
            auVar11._12_4_ <= auVar10._12_4_) {
          pUVar8->name = (TString *)0x0;
        }
        uVar9 = uVar9 + 2;
        pUVar8 = pUVar8 + 2;
      } while ((lVar6 + 1U & 0xfffffffffffffffe) != uVar9);
      goto LAB_001118a6;
    }
  }
  pUVar4 = (o->p).upvalues;
LAB_001118a6:
  bVar5 = fs->nups;
  pUVar4[bVar5].instack = v->k == VLOCAL;
  pUVar4[bVar5].idx = *(lu_byte *)&v->u;
  pUVar4[bVar5].name = name;
  if ((((name->tsv).marked & 3) != 0) && (((o->gch).marked & 4) != 0)) {
    luaC_barrier_(fs->ls->L,o,(GCObject *)name);
    bVar5 = fs->nups;
  }
  fs->nups = bVar5 + 1;
  return (uint)bVar5;
}

Assistant:

static int newupvalue (FuncState *fs, TString *name, expdesc *v) {
  Proto *f = fs->f;
  int oldsize = f->sizeupvalues;
  checklimit(fs, fs->nups + 1, MAXUPVAL, "upvalues");
  luaM_growvector(fs->ls->L, f->upvalues, fs->nups, f->sizeupvalues,
                  Upvaldesc, MAXUPVAL, "upvalues");
  while (oldsize < f->sizeupvalues) f->upvalues[oldsize++].name = NULL;
  f->upvalues[fs->nups].instack = (v->k == VLOCAL);
  f->upvalues[fs->nups].idx = cast_byte(v->u.info);
  f->upvalues[fs->nups].name = name;
  luaC_objbarrier(fs->ls->L, f, name);
  return fs->nups++;
}